

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

bool doctest::detail::parseFlagImpl(int argc,char **argv,char *pattern)

{
  char cVar1;
  char *__haystack;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  
  if (argc < 1) {
    return false;
  }
  uVar7 = (ulong)(uint)argc;
  do {
    __haystack = argv[uVar7 - 1];
    pcVar3 = strstr(__haystack,pattern);
    if (pcVar3 != (char *)0x0) {
      pcVar4 = (char *)0x0;
      do {
        pcVar5 = pcVar3 + (long)pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (*pcVar5 != '\0');
      pcVar5 = pattern + -1;
      pcVar6 = pattern;
      if (pattern == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        do {
          pcVar5 = pcVar5 + 1;
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar1 != '\0');
      }
      if (pcVar5 + (1 - (long)pattern) == pcVar4) {
        do {
          if (pcVar3 == __haystack) {
            if (*__haystack == '-') {
              return true;
            }
            break;
          }
          pcVar4 = pcVar3 + -1;
          pcVar3 = pcVar3 + -1;
        } while (*pcVar4 == '-');
      }
    }
    bVar2 = (long)uVar7 < 2;
    uVar7 = uVar7 - 1;
    if (bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool parseFlagImpl(int argc, const char* const* argv, const char* pattern) {
        for(int i = argc - 1; i >= 0; --i) {
            const char* temp = strstr(argv[i], pattern);
            if(temp && my_strlen(temp) == my_strlen(pattern)) {
                // eliminate strings in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                while(temp != argv[i]) {
                    if(*--temp != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[i][0] == '-')
                    return true;
            }
        }
        return false;
    }